

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O1

bool __thiscall
MeCab::Writer::writeNode(Writer *this,Lattice *lattice,char *p,Node *node,StringBuffer *os)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *__dest;
  undefined8 *puVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uchar *puVar9;
  char *pcVar10;
  unsigned_short *puVar11;
  uint uVar12;
  size_t sVar13;
  Node *__n;
  float *pfVar14;
  uchar *__buf_00;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *extraout_RDX_05;
  uchar *extraout_RDX_06;
  uchar *extraout_RDX_07;
  uchar *extraout_RDX_08;
  uchar *extraout_RDX_09;
  uchar *extraout_RDX_10;
  uchar *extraout_RDX_11;
  uchar *extraout_RDX_12;
  uchar *extraout_RDX_13;
  uchar *extraout_RDX_14;
  uchar *extraout_RDX_15;
  uchar *extraout_RDX_16;
  uchar *extraout_RDX_17;
  uchar *extraout_RDX_18;
  uchar *extraout_RDX_19;
  uchar *extraout_RDX_20;
  uchar *extraout_RDX_21;
  uint *puVar15;
  uchar *extraout_RDX_22;
  uchar *extraout_RDX_23;
  uchar *extraout_RDX_24;
  undefined8 *puVar16;
  ulong uVar17;
  mecab_path_t *pmVar18;
  long n;
  char *pcVar19;
  char *pcVar20;
  byte *pbVar21;
  char *pcVar22;
  char *pcVar23;
  bool bVar24;
  string error;
  ulong local_b0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  unsigned_short *local_80;
  unsigned_short *local_78;
  float *local_70;
  unsigned_short *local_68;
  float *local_60;
  float *local_58;
  unsigned_short *local_50;
  uchar *local_48;
  byte *local_40;
  uchar *local_38;
  void *__buf;
  
  __dest = (char *)operator_new__(0x2000);
  puVar8 = (undefined8 *)operator_new__(0x200);
  bVar3 = *p;
  bVar24 = bVar3 == 0;
  if (!bVar24) {
    local_80 = &node->rcAttr;
    local_78 = &node->lcAttr;
    local_68 = &node->rlength;
    local_50 = &node->length;
    local_70 = &node->beta;
    local_58 = &node->alpha;
    local_60 = &node->prob;
    local_48 = &node->stat;
    local_38 = &node->char_type;
    local_b0 = 0;
    __buf_00 = local_48;
    do {
      if (bVar3 != 0x25) {
        if (bVar3 == 0x5c) {
          bVar3 = ((byte *)p)[1];
          sVar13 = (size_t)bVar3;
          bVar4 = 0;
          if (bVar3 < 0x66) {
            if (bVar3 == 0x5c) {
              bVar4 = 0x5c;
            }
            else if (bVar3 == 0x61) {
              bVar4 = 7;
            }
            else if (bVar3 == 0x62) {
              bVar4 = 8;
            }
          }
          else {
            __buf_00 = (uchar *)(ulong)(bVar3 - 0x6e);
            bVar4 = 0;
            if (bVar3 - 0x6e < 9) {
              sVar13 = (long)&switchD_0012d0c1::switchdataD_001331a4 +
                       (long)(int)(&switchD_0012d0c1::switchdataD_001331a4)[(long)__buf_00];
              switch(__buf_00) {
              case (uchar *)0x0:
                bVar4 = 10;
                break;
              case (uchar *)0x4:
                bVar4 = 0xd;
                break;
              case (uchar *)0x5:
                bVar4 = 0x20;
                break;
              case (uchar *)0x6:
                bVar4 = 9;
                break;
              case (uchar *)0x8:
                bVar4 = 0xb;
              }
            }
            else if (bVar3 == 0x66) {
              bVar4 = 0xc;
            }
          }
          StringBuffer::write(os,(uint)bVar4,__buf_00,sVar13);
          pbVar21 = (byte *)p + 1;
          puVar15 = (uint *)extraout_RDX_01;
        }
        else {
          StringBuffer::write(os,(int)(char)bVar3,__buf_00,(ulong)bVar3);
          puVar15 = (uint *)extraout_RDX_00;
          pbVar21 = (byte *)p;
        }
        goto LAB_0012d218;
      }
      pbVar21 = (byte *)p + 1;
      bVar3 = ((byte *)p)[1];
      if (bVar3 < 99) {
        __n = (Node *)(ulong)(bVar3 - 0x46);
        switch(__n) {
        case (Node *)0x0:
switchD_0012d0f2_caseD_46:
          if (*node->feature == '\0') {
            pcVar22 = "no feature information available";
LAB_0012d895:
            (*lattice->_vptr_Lattice[0x25])(lattice,pcVar22);
            goto LAB_0012d913;
          }
          local_40 = (byte *)p;
          if (local_b0 == 0) {
            strncpy(__dest,node->feature,0x2000);
            sVar13 = strlen(__dest);
            if ((long)sVar13 < 1) {
              local_b0 = 0;
            }
            else {
              pcVar23 = __dest + sVar13;
              uVar17 = 0x40;
              local_b0 = 0;
              puVar16 = puVar8;
              pcVar22 = __dest;
              do {
                for (; (cVar2 = *pcVar22, cVar2 == '\t' || (cVar2 == ' ')); pcVar22 = pcVar22 + 1) {
                }
                if (cVar2 == '\"') {
                  pcVar22 = pcVar22 + 1;
                  pcVar20 = pcVar22;
                  for (pcVar10 = pcVar22;
                      (pcVar19 = pcVar10, pcVar10 < pcVar23 &&
                      ((*pcVar10 != '\"' ||
                       (pcVar19 = pcVar10 + 1, pcVar1 = pcVar10 + 1, pcVar10 = pcVar19,
                       *pcVar1 == '\"')))); pcVar10 = pcVar10 + 1) {
                    *pcVar20 = *pcVar10;
                    pcVar20 = pcVar20 + 1;
                  }
                  local_a0[0] = (undefined1 *)CONCAT71(local_a0[0]._1_7_,0x2c);
                  pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pcVar19,pcVar23,local_a0);
                }
                else {
                  local_a0[0] = (undefined1 *)CONCAT71(local_a0[0]._1_7_,0x2c);
                  pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pcVar22,pcVar23,local_a0);
                  pcVar20 = pcVar10;
                }
                if (1 < uVar17) {
                  *pcVar20 = '\0';
                }
                uVar17 = uVar17 - 1;
                *puVar16 = pcVar22;
                local_b0 = local_b0 + 1;
                if (uVar17 == 0) break;
                puVar16 = puVar16 + 1;
                pcVar22 = pcVar10 + 1;
              } while (pcVar22 < pcVar23);
            }
          }
          bVar3 = 9;
          if (*pbVar21 == 0x46) {
            bVar3 = local_40[2];
            if (bVar3 == 0x5c) {
              bVar4 = local_40[3];
              pbVar21 = local_40 + 3;
              bVar3 = 0;
              if (bVar4 < 0x66) {
                if (bVar4 == 0x5c) {
                  bVar3 = 0x5c;
                }
                else if (bVar4 == 0x61) {
                  bVar3 = 7;
                }
                else if (bVar4 == 0x62) {
                  bVar3 = 8;
                }
              }
              else {
                bVar3 = 0;
                switch(bVar4) {
                case 0x6e:
                  bVar3 = 10;
                  break;
                case 0x6f:
                case 0x70:
                case 0x71:
                case 0x75:
                  break;
                case 0x72:
                  bVar3 = 0xd;
                  break;
                case 0x73:
                  bVar3 = 0x20;
                  break;
                case 0x74:
                  bVar3 = 9;
                  break;
                case 0x76:
                  bVar3 = 0xb;
                  break;
                default:
                  if (bVar4 == 0x66) {
                    bVar3 = 0xc;
                  }
                }
              }
            }
            else {
              pbVar21 = local_40 + 2;
            }
          }
          if (pbVar21[1] == 0x5b) {
            pbVar21 = pbVar21 + 2;
            uVar17 = 0;
            bVar5 = false;
            while( true ) {
              bVar4 = *pbVar21;
              puVar15 = (uint *)(ulong)(bVar4 - 0x30);
              if (9 < bVar4 - 0x30) break;
              uVar17 = ((long)(char)bVar4 + uVar17 * 10) - 0x30;
LAB_0012d4ab:
              pbVar21 = pbVar21 + 1;
            }
            if ((bVar4 == 0x2c) || (bVar4 == 0x5d)) {
              if (uVar17 < local_b0) {
                pcVar22 = (char *)puVar8[uVar17];
                cVar2 = *pcVar22;
                if (cVar2 != '*') {
                  if (bVar5) {
                    StringBuffer::write(os,(int)(char)bVar3,puVar15,(size_t)pcVar22);
                    puVar15 = (uint *)extraout_RDX_10;
                  }
                  StringBuffer::write(os,(int)puVar8[uVar17],puVar15,(size_t)pcVar22);
                  puVar15 = (uint *)extraout_RDX_11;
                }
                if (*pbVar21 != 0x5d) {
                  uVar17 = 0;
                  bVar5 = cVar2 != '*';
                  goto LAB_0012d4ab;
                }
                bVar5 = true;
                goto LAB_0012d5ad;
              }
              pcVar22 = "given index is out of range";
            }
            else {
              pcVar22 = "cannot find \']\'";
            }
            (*lattice->_vptr_Lattice[0x25])(lattice,pcVar22);
            bVar5 = false;
            puVar15 = (uint *)extraout_RDX_13;
          }
          else {
            (*lattice->_vptr_Lattice[0x25])(lattice,"cannot find \'[\'");
            pbVar21 = pbVar21 + 1;
            bVar5 = false;
            puVar15 = (uint *)extraout_RDX_12;
          }
LAB_0012d5ad:
          if (!bVar5) goto LAB_0012d913;
          break;
        case (Node *)0x1:
        case (Node *)0x3:
        case (Node *)0x4:
        case (Node *)0x5:
        case (Node *)0x8:
        case (Node *)0x9:
        case (Node *)0xb:
        case (Node *)0xc:
switchD_0012d0f2_caseD_47:
          pcVar22 = "unknown meta char: " + (char)*pbVar21;
          local_a0[0] = local_90;
          sVar13 = strlen(pcVar22);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,pcVar22,pcVar22 + sVar13);
          (*lattice->_vptr_Lattice[0x25])(lattice,local_a0[0]);
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0]);
          }
          goto LAB_0012d913;
        case (Node *)0x2:
          StringBuffer::write(os,(int)node->feature,&switchD_0012d0f2::switchdataD_00133090,
                              (size_t)__n);
          puVar15 = (uint *)extraout_RDX;
          break;
        case (Node *)0x6:
          iVar6 = (*lattice->_vptr_Lattice[0xb])();
          StringBuffer::operator<<(os,CONCAT44(extraout_var,iVar6));
          puVar15 = (uint *)extraout_RDX_06;
          break;
        case (Node *)0x7:
          __buf = (void *)(ulong)node->rlength;
          iVar6 = (uint)node->length + ((int)node->surface - (uint)node->rlength);
          __n = node;
          goto LAB_0012d34d;
        case (Node *)0xa:
          StringBuffer::operator<<(os,(double)node->prob);
          puVar15 = (uint *)extraout_RDX_04;
          break;
        case (Node *)0xd:
          iVar6 = (*lattice->_vptr_Lattice[8])();
          iVar7 = (*lattice->_vptr_Lattice[0xb])();
          __buf = (void *)CONCAT44(extraout_var_00,iVar7);
LAB_0012d34d:
          StringBuffer::write(os,iVar6,__buf,(size_t)__n);
          puVar15 = (uint *)extraout_RDX_08;
          break;
        default:
          if (bVar3 != 0x25) goto switchD_0012d0f2_caseD_47;
          StringBuffer::write(os,0x25,__buf_00,(size_t)__n);
          puVar15 = (uint *)extraout_RDX_02;
        }
      }
      else {
        uVar12 = bVar3 - 0x66;
        if (0xe < uVar12) {
          if (bVar3 != 99) goto switchD_0012d0f2_caseD_47;
          StringBuffer::operator<<(os,(int)node->wcost);
          puVar15 = (uint *)extraout_RDX_03;
          goto LAB_0012d218;
        }
        __n = (Node *)((long)&switchD_0012d13f::switchdataD_001330c8 +
                      (long)(int)(&switchD_0012d13f::switchdataD_001330c8)[uVar12]);
        puVar9 = local_38;
        switch((uint)bVar3) {
        case 0x66:
          goto switchD_0012d0f2_caseD_46;
        default:
          goto switchD_0012d0f2_caseD_47;
        case 0x68:
          StringBuffer::operator<<(os,node->posid);
          puVar15 = (uint *)extraout_RDX_07;
          goto LAB_0012d218;
        case 0x6d:
          iVar6 = (int)node->surface;
          __buf = (void *)(ulong)node->length;
          goto LAB_0012d34d;
        case 0x70:
          pbVar21 = (byte *)p + 2;
          bVar3 = ((byte *)p)[2];
          if (bVar3 < 0x50) {
            if (bVar3 < 0x43) {
              pfVar14 = local_58;
              if ((bVar3 == 0x41) || (pfVar14 = local_70, bVar3 == 0x42)) goto LAB_0012d617;
            }
            else {
              if (bVar3 == 0x43) {
                n = node->cost - ((long)node->wcost + node->prev->cost);
                goto LAB_0012d6b7;
              }
              puVar11 = local_68;
              if (bVar3 == 0x4c) goto switchD_0012d2cc_caseD_6c;
            }
switchD_0012d2cc_caseD_64:
            pcVar22 = "[iseSCwcnblLh] is required after %p";
            goto LAB_0012d895;
          }
          uVar12 = bVar3 - 0x62;
          if (0x15 < uVar12) {
            pfVar14 = local_60;
            if (bVar3 == 0x50) {
LAB_0012d617:
              StringBuffer::operator<<(os,(double)*pfVar14);
              puVar15 = (uint *)extraout_RDX_16;
            }
            else {
              if (bVar3 != 0x53) goto switchD_0012d2cc_caseD_64;
              StringBuffer::write(os,((int)node->surface - (uint)node->rlength) + (uint)node->length
                                  ,(void *)((ulong)node->rlength - (ulong)node->length),
                                  (size_t)local_60);
              puVar15 = (uint *)extraout_RDX_15;
            }
            goto LAB_0012d218;
          }
          break;
        case 0x73:
          puVar9 = local_48;
        case 0x74:
          StringBuffer::operator<<(os,(uint)*puVar9);
          puVar15 = (uint *)extraout_RDX_09;
          goto LAB_0012d218;
        }
        sVar13 = (long)&switchD_0012d2cc::switchdataD_00133128 +
                 (long)(int)(&switchD_0012d2cc::switchdataD_00133128)[uVar12];
        puVar11 = local_50;
        switch((uint)bVar3) {
        case 0x62:
          iVar6 = 0x2a;
          if (node->isbest == '\0') {
            iVar6 = 0x20;
          }
          StringBuffer::write(os,iVar6,__buf_00,sVar13);
          puVar15 = (uint *)extraout_RDX_05;
          break;
        case 99:
          n = node->cost;
          goto LAB_0012d6b7;
        default:
          goto switchD_0012d2cc_caseD_64;
        case 0x65:
          pcVar22 = node->surface;
          iVar6 = (*lattice->_vptr_Lattice[8])();
          iVar6 = (uint)node->length + ((int)pcVar22 - iVar6);
          goto LAB_0012d700;
        case 0x68:
          puVar11 = local_78;
          if ((((byte *)p)[3] != 0x6c) && (puVar11 = local_80, ((byte *)p)[3] != 0x72)) {
            pcVar22 = "lr is required after %ph";
            goto LAB_0012d895;
          }
          StringBuffer::operator<<(os,*puVar11);
          pbVar21 = (byte *)p + 3;
          puVar15 = (uint *)extraout_RDX_18;
          break;
        case 0x69:
          StringBuffer::operator<<(os,node->id);
          puVar15 = (uint *)extraout_RDX_21;
          break;
        case 0x6c:
switchD_0012d2cc_caseD_6c:
          StringBuffer::operator<<(os,*puVar11);
          puVar15 = (uint *)extraout_RDX_14;
          break;
        case 0x6e:
          n = node->cost - node->prev->cost;
LAB_0012d6b7:
          StringBuffer::operator<<(os,n);
          puVar15 = (uint *)extraout_RDX_19;
          break;
        case 0x70:
          bVar3 = ((byte *)p)[4];
          puVar15 = (uint *)__buf_00;
          if (bVar3 == 0x5c) {
            pbVar21 = (byte *)p + 5;
            bVar4 = ((byte *)p)[5];
            bVar3 = 0;
            if (bVar4 < 0x66) {
              if (bVar4 == 0x5c) {
                bVar3 = 0x5c;
              }
              else if (bVar4 == 0x61) {
                bVar3 = 7;
              }
              else if (bVar4 == 0x62) {
                bVar3 = 8;
              }
            }
            else {
              sVar13 = (size_t)(bVar4 - 0x6e);
              puVar15 = &switchD_0012d766::switchdataD_00133180;
              bVar3 = 0;
              switch(sVar13) {
              case 0:
                bVar3 = 10;
                break;
              case 1:
              case 2:
              case 3:
              case 7:
                break;
              case 4:
                bVar3 = 0xd;
                break;
              case 5:
                bVar3 = 0x20;
                break;
              case 6:
                bVar3 = 9;
                break;
              case 8:
                bVar3 = 0xb;
                break;
              default:
                puVar15 = (uint *)__buf_00;
                if (bVar4 == 0x66) {
                  bVar3 = 0xc;
                }
              }
            }
          }
          else {
            pbVar21 = (byte *)p + 4;
          }
          pmVar18 = node->lpath;
          if (pmVar18 == (mecab_path_t *)0x0) {
            (*lattice->_vptr_Lattice[0x25])(lattice,"no path information is available");
            goto LAB_0012d913;
          }
          bVar4 = ((byte *)p)[3];
          do {
            if (pmVar18 != node->lpath) {
              StringBuffer::write(os,(int)(char)bVar3,puVar15,sVar13);
            }
            if (bVar4 == 0x50) {
              StringBuffer::operator<<(os,(double)pmVar18->prob);
              puVar15 = (uint *)extraout_RDX_24;
            }
            else if (bVar4 == 99) {
              StringBuffer::operator<<(os,pmVar18->cost);
              puVar15 = (uint *)extraout_RDX_23;
            }
            else {
              if (bVar4 != 0x69) {
                (*lattice->_vptr_Lattice[0x25])(lattice,"[icP] is required after %pp");
                goto LAB_0012d913;
              }
              StringBuffer::operator<<(os,pmVar18->lnode->id);
              puVar15 = (uint *)extraout_RDX_22;
            }
            pmVar18 = pmVar18->lnext;
          } while (pmVar18 != (mecab_path_t *)0x0);
          break;
        case 0x73:
          pcVar22 = node->surface;
          iVar6 = (*lattice->_vptr_Lattice[8])();
          iVar6 = (int)pcVar22 - iVar6;
LAB_0012d700:
          StringBuffer::operator<<(os,iVar6);
          puVar15 = (uint *)extraout_RDX_20;
          break;
        case 0x77:
          StringBuffer::operator<<(os,node->wcost);
          puVar15 = (uint *)extraout_RDX_17;
        }
      }
LAB_0012d218:
      bVar3 = pbVar21[1];
      p = (char *)(pbVar21 + 1);
      bVar24 = bVar3 == 0;
      __buf_00 = (uchar *)puVar15;
    } while (!bVar24);
  }
LAB_0012d913:
  operator_delete__(puVar8);
  operator_delete__(__dest);
  return bVar24;
}

Assistant:

bool Writer::writeNode(Lattice *lattice,
                       const char *p,
                       const Node *node,
                       StringBuffer *os) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, 64> ptr;
  size_t psize = 0;

  for (; *p; p++) {
    switch (*p) {
      default: *os << *p; break;

      case '\\': *os << getEscapedChar(*++p); break;

      case '%': {  // macros
        switch (*++p) {
          default: {
            const std::string error = "unknown meta char: " + *p;
            lattice->set_what(error.c_str());
            return false;
          }
            // input sentence
          case 'S': os->write(lattice->sentence(), lattice->size()); break;
            // sentence length
          case 'L': *os << lattice->size(); break;
            // morph
          case 'm': os->write(node->surface, node->length); break;
          case 'M': os->write(reinterpret_cast<const char *>
                              (node->surface - node->rlength + node->length),
                              node->rlength);
            break;
          case 'h': *os << node->posid; break;  // Part-Of-Speech ID
          case '%': *os << '%'; break;         // %
          case 'c': *os << static_cast<int>(node->wcost); break;  // word cost
          case 'H': *os << node->feature; break;
          case 't': *os << static_cast<unsigned int>(node->char_type); break;
          case 's': *os << static_cast<unsigned int>(node->stat); break;
          case 'P': *os << node->prob; break;
          case 'p': {
            switch (*++p) {
              default:
                lattice->set_what("[iseSCwcnblLh] is required after %p");
                return false;
              case 'i': *os << node->id; break;  // node id
              case 'S': os->write(reinterpret_cast<const char*>
                                  (node->surface -
                                   node->rlength + node->length),
                                  node->rlength - node->length);
                break;  // space
                // start position
              case 's': *os << static_cast<int>(
                  node->surface - lattice->sentence());
                break;
                // end position
              case 'e': *os << static_cast<int>
                    (node->surface - lattice->sentence() + node->length);
                break;
                // connection cost
              case 'C': *os << node->cost -
                    node->prev->cost - node->wcost;
                break;
              case 'w': *os << node->wcost; break;  // word cost
              case 'c': *os << node->cost; break;  // best cost
              case 'n': *os << (node->cost - node->prev->cost); break;
                // node cost
                // * if best path, otherwise ' '
              case 'b': *os << (node->isbest ? '*' : ' '); break;
              case 'P': *os << node->prob; break;
              case 'A': *os << node->alpha; break;
              case 'B': *os << node->beta; break;
              case 'l': *os << node->length; break;  // length of morph
                // length of morph including the spaces
              case 'L': *os << node->rlength;    break;
              case 'h': {  // Hidden Layer ID
                switch (*++p) {
                  default:
                    lattice->set_what("lr is required after %ph");
                    return false;
                  case 'l': *os << node->lcAttr; break;   // current
                  case 'r': *os << node->rcAttr; break;   // prev
                }
              } break;

              case 'p': {
                char mode = *++p;
                char sep = *++p;
                if (sep == '\\') {
                  sep = getEscapedChar(*++p);
                }
                if (!node->lpath) {
                  lattice->set_what("no path information is available");
                  return false;
                }
                for (Path *path = node->lpath; path; path = path->lnext) {
                  if (path != node->lpath) *os << sep;
                  switch (mode) {
                    case 'i': *os << path->lnode->id; break;
                    case 'c': *os << path->cost; break;
                    case 'P': *os << path->prob; break;
                    default:
                      lattice->set_what("[icP] is required after %pp");
                      return false;
                  }
                }
              } break;

            }
          } break;

          case 'F':
          case 'f': {
            if (node->feature[0] == '\0') {
              lattice->set_what("no feature information available");
              return false;
            }
            if (!psize) {
              std::strncpy(buf.get(), node->feature, buf.size());
              psize = tokenizeCSV(buf.get(), ptr.get(), ptr.size());
            }

            // separator
            char separator = '\t';  // default separator
            if (*p == 'F') {  // change separator
              if (*++p == '\\') {
                separator = getEscapedChar(*++p);
              } else {
                separator = *p;
              }
            }

            if (*++p !='[') {
              lattice->set_what("cannot find '['");
              return false;
            }
            size_t n = 0;
            bool sep = false;
            bool isfil = false;
            p++;

            for (;; ++p) {
              switch (*p) {
                case '0': case '1': case '2': case '3': case '4':
                case '5': case '6': case '7': case '8': case '9':
                  n = 10 * n +(*p - '0');
                  break;
                case ',': case ']':
                  if (n >= psize) {
                    lattice->set_what("given index is out of range");
                    return false;
                  }
                  isfil = (ptr[n][0] != '*');
                  if (isfil) {
                    if (sep) {
                      *os << separator;
                    }
                    *os << ptr[n];
                  }
                  if (*p == ']') {
                    goto last;
                  }
                  sep = isfil;
                  n = 0;
                  break;
                default:
                  lattice->set_what("cannot find ']'");
                  return false;
              }
            }
          } last: break;
        }  // end switch
      } break;  // end case '%'
    }  // end switch
  }

  return true;
}